

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

void act_area(char *format,CHAR_DATA *ch,CHAR_DATA *victim)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  CHAR_DATA *pCVar6;
  ROOM_INDEX_DATA *pRVar7;
  DESCRIPTOR_DATA **ppDVar8;
  bool bVar9;
  ulong uVar10;
  char *pcVar11;
  char cVar12;
  char **ppcVar13;
  DESCRIPTOR_DATA *pDVar14;
  size_t sVar15;
  char *pcVar16;
  char *pcVar17;
  string_view fmt;
  char buf2 [4608];
  char buf [4608];
  char local_2438 [4608];
  char local_1238;
  char local_1237 [4615];
  
  if (((format != (char *)0x0) && (*format != '\0')) &&
     (pDVar14 = descriptor_list, descriptor_list != (DESCRIPTOR_DATA *)0x0)) {
    do {
      if (((((pDVar14->connected == 0) && (pCVar6 = pDVar14->character, pCVar6 != (CHAR_DATA *)0x0))
           && ((pRVar7 = pCVar6->in_room, pRVar7 != (ROOM_INDEX_DATA *)0x0 &&
               ((pRVar7->area == ch->in_room->area && ((pCVar6->comm[0] & 1) == 0)))))) &&
          ((pRVar7->room_flags[0] & 0x200000) == 0)) && (bVar9 = is_awake(pCVar6), bVar9)) {
        pCVar6 = pDVar14->character;
        bVar9 = is_npc(pCVar6);
        if ((bVar9) || (pCVar6->desc != (DESCRIPTOR_DATA *)0x0)) {
          pcVar16 = &local_1238;
          pcVar17 = format;
LAB_0027a2e7:
          while (cVar1 = *pcVar17, cVar1 == '$') {
            bVar2 = pcVar17[1];
            if ((byte)(bVar2 + 0xbf) < 0x1a) {
              sVar15 = 0x1e;
              pcVar11 = "Act: missing arg2 for code {}.";
LAB_0027a324:
              fmt._M_str = pcVar11;
              fmt._M_len = sVar15;
              CLogger::Warn<char_const&>((CLogger *)&RS.field_0x140,fmt,pcVar17 + 1);
              pcVar11 = " <@@@> ";
            }
            else {
              if (bVar2 < 0x6e) {
                if (bVar2 == 0x65) {
                  uVar4 = victim->sex;
                  if (1 < (short)uVar4) {
                    uVar4 = 2;
                  }
                  if ((short)uVar4 < 1) {
                    uVar4 = 0;
                  }
                  uVar10 = (ulong)uVar4;
                  ppcVar13 = act_area::he_she;
                }
                else {
                  if (bVar2 != 0x6d) {
LAB_0027a390:
                    sVar15 = 0x11;
                    pcVar11 = "Act: bad code {}.";
                    goto LAB_0027a324;
                  }
                  uVar3 = victim->sex;
                  if (1 < (short)uVar3) {
                    uVar3 = 2;
                  }
                  if ((short)uVar3 < 1) {
                    uVar3 = 0;
                  }
                  uVar10 = (ulong)uVar3;
                  ppcVar13 = act_area::him_her;
                }
              }
              else {
                if (bVar2 != 0x73) {
                  if (bVar2 != 0x6e) goto LAB_0027a390;
                  pcVar11 = get_descr_form(victim,ch,false);
                  goto LAB_0027a3ff;
                }
                uVar5 = victim->sex;
                if (1 < (short)uVar5) {
                  uVar5 = 2;
                }
                if ((short)uVar5 < 1) {
                  uVar5 = 0;
                }
                uVar10 = (ulong)uVar5;
                ppcVar13 = act_area::his_her;
              }
              pcVar11 = ppcVar13[uVar10];
            }
LAB_0027a3ff:
            pcVar17 = pcVar17 + 2;
            cVar1 = *pcVar11;
            *pcVar16 = cVar1;
            while (cVar1 != '\0') {
              pcVar11 = pcVar11 + 1;
              cVar1 = *pcVar11;
              pcVar16[1] = cVar1;
              pcVar16 = pcVar16 + 1;
            }
          }
          if (cVar1 != '\0') {
            pcVar17 = pcVar17 + 1;
            *pcVar16 = cVar1;
            pcVar16 = pcVar16 + 1;
            goto LAB_0027a2e7;
          }
          *pcVar16 = '\0';
          if (pCVar6->desc != (DESCRIPTOR_DATA *)0x0) {
            pcVar17 = ch->short_descr;
            pcVar11 = get_char_color(pCVar6,"yells");
            sprintf(local_2438,"%s yells \'%s",pcVar17,pcVar11);
            cVar1 = (char)local_2438._0_4_;
            cVar12 = cVar1 + -0x20;
            if (0x19 < (byte)(cVar1 + 0x9fU)) {
              cVar12 = cVar1;
            }
            local_2438[0] = cVar12;
            send_to_char(local_2438,pCVar6);
            write_to_buffer(pCVar6->desc,&local_1238,(int)pcVar16 - (int)&local_1238);
            pcVar16 = END_COLOR(pCVar6);
            sprintf(local_2438,"%s\'\n\r",pcVar16);
            send_to_char(local_2438,pCVar6);
          }
        }
      }
      ppDVar8 = &pDVar14->next;
      pDVar14 = *ppDVar8;
    } while (*ppDVar8 != (DESCRIPTOR_DATA *)0x0);
  }
  return;
}

Assistant:

void act_area(const char *format, CHAR_DATA *ch, CHAR_DATA *victim)
{
	static char *const he_she[] = {"it", "he", "she"};
	static char *const him_her[] = {"it", "him", "her"};
	static char *const his_her[] = {"its", "his", "her"};
	char buf[MAX_STRING_LENGTH], buf2[MSL];
	CHAR_DATA *to;
	const char *str;
	const char *i;
	char *point;
	DESCRIPTOR_DATA *d;

	/*
	 * Discard null and zero-length messages.
	 */
	if (format == nullptr || format[0] == '\0')
		return;

	/*colorconv(format, format, ch);*/
	for (d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING
			&& d->character
			&& d->character->in_room != nullptr
			&& d->character->in_room->area == ch->in_room->area
			&& !IS_SET(d->character->comm, COMM_QUIET))
		{
			if (IS_SET(d->character->in_room->room_flags, ROOM_SILENCE))
				continue;

			if (!is_awake(d->character))
				continue;

			to = d->character;

			if ((!is_npc(to) && to->desc == nullptr))
				continue;

			point = buf;
			str = format;

			while (*str != '\0')
			{
				if (*str != '$')
				{
					*point++ = *str++;
					continue;
				}

				++str;

				if (*str >= 'A' && *str <= 'Z')
				{
					RS.Logger.Warn("Act: missing arg2 for code {}.", *str);
					i = " <@@@> ";
				}
				else
				{
					switch (*str)
					{
						/* Thx alex for 't' idea */
						case 'n':
							i = get_descr_form(victim, ch, false);
							break;
						case 'e':
							i = he_she[URANGE(0, victim->sex, 2)];
							break;
						case 'm':
							i = him_her[URANGE(0, victim->sex, 2)];
							break;
						case 's':
							i = his_her[URANGE(0, victim->sex, 2)];
							break;
						default:
							RS.Logger.Warn("Act: bad code {}.", *str);
							i = " <@@@> ";
							break;
					}
				}

				++str;

				while ((*point = *i) != '\0')
				{
					++point, ++i;
				}
			}

			*point = '\0';

			if (to->desc != nullptr)
			{
				sprintf(buf2, "%s yells '%s", ch->short_descr, get_char_color(to, "yells"));
				buf2[0] = UPPER(buf2[0]);
				send_to_char(buf2, to);

				write_to_buffer(to->desc, buf, point - buf);

				sprintf(buf2, "%s'\n\r", END_COLOR(to));
				send_to_char(buf2, to);
			}
		}
	}
}